

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.cpp
# Opt level: O0

string * vimEditCommand(string *path,optional<std::pair<int,_int>_> location,string *vimArgs)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string col;
  string line;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  
  __lhs = in_RDI;
  std::operator+((char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 in_stack_fffffffffffffe90);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::string::~string(in_RDI);
  std::__cxx11::string::~string(in_RDI);
  std::__cxx11::string::~string(in_RDI);
  bVar1 = std::optional::operator_cast_to_bool((optional<std::pair<int,_int>_> *)0x107840);
  if (bVar1) {
    std::optional<std::pair<int,_int>_>::operator*((optional<std::pair<int,_int>_> *)0x107856);
    std::get<0ul,int,int>((pair<int,_int> *)0x10785e);
    std::__cxx11::to_string(in_stack_fffffffffffffe9c);
    std::optional<std::pair<int,_int>_>::operator*((optional<std::pair<int,_int>_> *)0x10787a);
    std::get<1ul,int,int>((pair<int,_int> *)0x107882);
    std::__cxx11::to_string(in_stack_fffffffffffffe9c);
    std::operator+(in_stack_fffffffffffffe88,
                   (char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    std::operator+(__lhs,in_RDI);
    std::operator+(__lhs,(char *)in_RDI);
    std::operator+(__lhs,in_RDI);
    std::operator+(__lhs,(char *)in_RDI);
    std::__cxx11::string::~string(in_RDI);
    std::__cxx11::string::~string(in_RDI);
    std::__cxx11::string::~string(in_RDI);
    std::__cxx11::string::~string(in_RDI);
    std::__cxx11::string::~string(in_RDI);
    std::__cxx11::string::~string(in_RDI);
  }
  else {
    std::operator+(in_stack_fffffffffffffe88,
                   (char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  }
  std::__cxx11::string::~string(in_RDI);
  return __lhs;
}

Assistant:

[[nodiscard]] static std::string
vimEditCommand(const std::string &path,
               std::optional<std::pair<int, int>> location,
               const std::string &vimArgs = "") {
  const std::string prefix =
      "eval '$EDITOR " + vimArgs + "\\\"" + path + "\\\"";
  if (location) {
    let line = std::to_string(std::get<0>(*location));
    let col = std::to_string(std::get<1>(*location));
    return prefix + " \\\"+call cursor(" + line + ", " + col + ")\\\"'";
  }

  return prefix + "'";
}